

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void XPMP2::SoundSystemXP::PlayCallback(void *inRefcon,FMOD_RESULT status)

{
  SoundSystem *this;
  SoundChannel *pSVar1;
  int in_ESI;
  undefined8 in_RDI;
  SoundChannel *pChn;
  uint64_t sndId;
  SoundSystemXP *me;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *local_48;
  uint64_t in_stack_ffffffffffffffc0;
  
  if (gpSndSys == 0) {
    this = (SoundSystem *)0x0;
    local_48 = in_stack_ffffffffffffffa8;
  }
  else {
    this = (SoundSystem *)__dynamic_cast(gpSndSys,&SoundSystem::typeinfo,&typeinfo,0);
    local_48 = in_stack_ffffffffffffffa8;
  }
  if (this == (SoundSystem *)0x0) {
    if (glob < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x20c,"PlayCallback",logERR,"No XP Sound system in use!");
    }
  }
  else {
    if ((in_ESI != 0) && (pSVar1 = SoundSystem::GetChn(this,in_stack_ffffffffffffffc0), glob < 4)) {
      if ((pSVar1 == (SoundChannel *)0x0) || (pSVar1->pSnd == (SoundFile *)0x0)) {
        local_48 = "<NULL>";
      }
      else {
        local_48 = (char *)std::__cxx11::string::c_str();
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x217,"PlayCallback",logERR,
             "XPLMPlayPCMOnBus for sound %lu/\'%s\' caused FMOD error %d",in_RDI);
      in_stack_ffffffffffffffb0 = in_ESI;
    }
    SoundSystem::RemoveChn
              ((SoundSystem *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (uint64_t)local_48);
  }
  return;
}

Assistant:

void SoundSystemXP::PlayCallback (void*         inRefcon,
                                  FMOD_RESULT   status)
{
    // Sanity checks
    SoundSystemXP* me = dynamic_cast<SoundSystemXP*>(gpSndSys);
    if (!me) {
        LOG_MSG(logERR, "No XP Sound system in use!");
        return;
    }
    
    // Log any issue there might have been
    uint64_t sndId = uint64_t(inRefcon);
    if (status != FMOD_OK) {
        const SoundChannel* pChn = me->GetChn(sndId);
        LOG_MSG(logERR, "XPLMPlayPCMOnBus for sound %lu/'%s' caused FMOD error %d",
                (unsigned long)sndId,
                pChn && pChn->pSnd ? pChn->pSnd->filePath.c_str() : "<NULL>",
                status);
    }
    
    // Playback has ended, remove the sound channel entry
    me->RemoveChn(sndId);
}